

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.c
# Opt level: O0

ppointer p_tree_lookup(PTree *tree,pconstpointer key)

{
  pint pVar1;
  PTreeBaseNode *pPStack_28;
  pint cmp_result;
  PTreeBaseNode *cur_node;
  pconstpointer key_local;
  PTree *tree_local;
  
  if (tree != (PTree *)0x0) {
    pPStack_28 = tree->root;
    while (pPStack_28 != (PTreeBaseNode *)0x0) {
      pVar1 = (*tree->compare_func)(key,pPStack_28->key,tree->data);
      if (pVar1 < 0) {
        pPStack_28 = pPStack_28->left;
      }
      else {
        if (pVar1 < 1) {
          return pPStack_28->value;
        }
        pPStack_28 = pPStack_28->right;
      }
    }
  }
  return (ppointer)0x0;
}

Assistant:

P_LIB_API ppointer
p_tree_lookup (PTree		*tree,
	       pconstpointer	key)
{
	PTreeBaseNode	*cur_node;
	pint		cmp_result;

	if (P_UNLIKELY (tree == NULL))
		return NULL;

	cur_node = tree->root;

	while (cur_node != NULL) {
		cmp_result = tree->compare_func (key, cur_node->key, tree->data);

		if (cmp_result < 0)
			cur_node = cur_node->left;
		else if (cmp_result > 0)
			cur_node = cur_node->right;
		else
			return cur_node->value;
	}

	return NULL;
}